

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O3

RealType __thiscall OpenMD::HydroProp::getScalarPitch(HydroProp *this)

{
  double dVar1;
  int i;
  long lVar2;
  double dVar3;
  RealType RVar4;
  Vector3d evals;
  Mat3x3d evects;
  Mat3x3d P;
  Vector3<double> local_c8;
  SquareMatrix3<double> local_a8;
  Mat3x3d local_58;
  
  getPitchMatrix(&local_58,this);
  lVar2 = 0;
  local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_a8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  SquareMatrix3<double>::diagonalize(&local_58,&local_c8,&local_a8);
  dVar3 = 0.0;
  do {
    dVar1 = local_c8.super_Vector<double,_3U>.data_[lVar2];
    dVar3 = dVar3 + dVar1 * dVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  dVar3 = dVar3 / 3.0;
  if (dVar3 < 0.0) {
    RVar4 = sqrt(dVar3);
  }
  else {
    RVar4 = SQRT(dVar3);
  }
  return RVar4;
}

Assistant:

RealType HydroProp::getScalarPitch() {
    Mat3x3d P = getPitchMatrix();
    Vector3d evals;
    Mat3x3d evects;
    Mat3x3d::diagonalize(P, evals, evects);
    RealType pScalar(0.0);

    for (int i = 0; i < 3; i++) {
      pScalar += pow(evals[i], 2);
    }
    pScalar /= 3.0;

    return sqrt(pScalar);
  }